

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

void mctools_pathseps_generic(mcu8str *path)

{
  char cVar1;
  int iVar2;
  
  mcu8str_replace(path,'\\','/');
  cVar1 = mctools_drive_letter(path);
  if (cVar1 != '\0') {
    iVar2 = mctools_impl_has_winnamespace(path);
    path->c_str[(ulong)(iVar2 != 0) * 4] = cVar1;
  }
  return;
}

Assistant:

void mctools_pathseps_generic( mcu8str* path )
  {
    mcu8str_replace( path, '\\', '/' );
    //Upper case drive letter for consistency:
    char drive_letter = mctools_drive_letter( path );
    if ( drive_letter ) {
      if ( mctools_impl_has_winnamespace( path ) )
        path->c_str[4] = drive_letter;
      else
        path->c_str[0] = drive_letter;
    }
  }